

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

TClusterToLetterMap * Cipher::getNullCLMap(TClusters *clusters)

{
  size_type sVar1;
  mapped_type *pmVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  TClusterToLetterMap *in_RDI;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *unaff_retaddr;
  int i;
  TClusterToLetterMap *result;
  undefined4 local_18;
  TClusterToLetterMap *__k;
  
  __k = in_RDI;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1820d5)
  ;
  for (local_18 = 0; sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI),
      local_18 < (int)sVar1; local_18 = local_18 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_18);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](unaff_retaddr,(key_type_conflict *)__k);
    *pmVar2 = 0;
  }
  return in_RDI;
}

Assistant:

TClusterToLetterMap getNullCLMap(const TClusters & clusters) {
        TClusterToLetterMap result;

        for (int i = 0; i < (int) clusters.size(); ++i) {
            result[clusters[i]] = 0;
        }

        return result;
    }